

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O3

bool __thiscall
ritobin::io::impl_text_read::BinTextReader::read_value_visit(BinTextReader *this,List2 *value)

{
  bool bVar1;
  char *pos;
  char *msg;
  bool end;
  bool local_29;
  
  local_29 = false;
  pos = (this->reader).cur_;
  bVar1 = TextReader::read_nested_begin(&this->reader,&local_29);
  if (bVar1) {
    do {
      if (local_29 != false) {
        return true;
      }
      pos = (this->reader).cur_;
      bVar1 = read_element(this,&value->items,value->valueType);
      if (!bVar1) {
        msg = "read_element(value.items, value.valueType)";
        goto LAB_0012f957;
      }
      pos = (this->reader).cur_;
      bVar1 = TextReader::read_nested_separator_or_end(&this->reader,&local_29);
    } while (bVar1);
    msg = "reader.read_nested_separator_or_end(end)";
  }
  else {
    msg = "reader.read_nested_begin(end)";
  }
LAB_0012f957:
  bVar1 = fail_msg(this,msg,pos);
  return bVar1;
}

Assistant:

bool read_value_visit(List2& value) noexcept {
            bool end = false;
            bin_assert(reader.read_nested_begin(end));
            while (!end) {
                bin_assert(read_element(value.items, value.valueType));
                bin_assert(reader.read_nested_separator_or_end(end));
            }
            return true;
        }